

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<long,duckdb::string_t,duckdb::ArgMinMaxState<long,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<long,_duckdb::string_t> *state,long *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t new_value;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<long,duckdb::string_t,duckdb::ArgMinMaxState<long,duckdb::string_t>>
              (state,*x,(string_t)(y->value).pointer,binary);
    return;
  }
  state->arg = *x;
  new_value.value.pointer.ptr = (char *)binary;
  new_value.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value);
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}